

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O2

void __thiscall
ApprovalTests::ApprovalMismatchException::ApprovalMismatchException
          (ApprovalMismatchException *this,string *received,string *approved)

{
  string sStack_38;
  
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_0015e840;
  format(&sStack_38,(ApprovalMismatchException *)received,received,approved);
  ApprovalException::ApprovalException(&this->super_ApprovalException,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_0015e840;
  return;
}

Assistant:

ApprovalMismatchException::ApprovalMismatchException(const std::string& received,
                                                         const std::string& approved)
        : ApprovalException(format(received, approved))
    {
    }